

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

IGeneratorsForTest * __thiscall Catch::Context::findGeneratorsForCurrentTest(Context *this)

{
  int iVar1;
  undefined4 extraout_var;
  iterator iVar2;
  IGeneratorsForTest *pIVar3;
  string testName;
  key_type local_30;
  
  iVar1 = (*(this->super_IMutableContext).super_IContext._vptr_IContext[2])();
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x48))
            (&local_30,(long *)CONCAT44(extraout_var,iVar1));
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IGeneratorsForTest_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IGeneratorsForTest_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IGeneratorsForTest_*>_>_>
          ::find(&(this->m_generatorsByTestName)._M_t,&local_30);
  if ((_Rb_tree_header *)iVar2._M_node ==
      &(this->m_generatorsByTestName)._M_t._M_impl.super__Rb_tree_header) {
    pIVar3 = (IGeneratorsForTest *)0x0;
  }
  else {
    pIVar3 = *(IGeneratorsForTest **)(iVar2._M_node + 2);
  }
  std::__cxx11::string::~string((string *)&local_30);
  return pIVar3;
}

Assistant:

IGeneratorsForTest* findGeneratorsForCurrentTest() {
            std::string testName = getResultCapture().getCurrentTestName();

            std::map<std::string, IGeneratorsForTest*>::const_iterator it =
            m_generatorsByTestName.find( testName );
            return it != m_generatorsByTestName.end()
                ? it->second
                : NULL;
        }